

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap2.c
# Opt level: O1

void ftgcvsll_(int *A1,int *A2,LONGLONG *A3,LONGLONG *A4,int *A5,char *A6,char *A7,int *A8,int *A9,
              size_t C6,size_t C7)

{
  int colnum;
  uint uVar1;
  fitsfile *fptr;
  LONGLONG firstrow;
  LONGLONG firstelem;
  void *pvVar2;
  char *s;
  char **array;
  char *pcVar3;
  ulong uVar4;
  int nelem;
  ulong uVar5;
  int felem_len;
  int iVar6;
  size_t sVar7;
  unsigned_long gMinStrLen;
  int type;
  long repeat;
  
  gMinStrLen = 0x50;
  fptr = gFitsFiles[*A1];
  colnum = *A2;
  firstrow = *A3;
  firstelem = *A4;
  uVar1 = *A5;
  if ((((C6 < 4) || (*A6 != '\0')) || (A6[1] != '\0')) || ((A6[2] != '\0' || (A6[3] != '\0')))) {
    s = (char *)0x0;
    pvVar2 = memchr(A6,0,C6);
    if (pvVar2 == (void *)0x0) {
      sVar7 = 0x50;
      if (0x50 < C6) {
        sVar7 = C6;
      }
      s = (char *)malloc(sVar7 + 1);
      s[C6] = '\0';
      memcpy(s,A6,C6);
      kill_trailing(s,(char)A6);
      A6 = s;
    }
  }
  else {
    s = (char *)0x0;
    A6 = (char *)0x0;
  }
  ffgtcl(fptr,colnum,&type,&repeat,(long *)&gMinStrLen,A9);
  uVar5 = 1;
  if (1 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  if (type < 0) {
    uVar5 = 1;
  }
  felem_len = (int)C7;
  iVar6 = felem_len;
  if (C7 < gMinStrLen) {
    iVar6 = (int)gMinStrLen;
  }
  iVar6 = iVar6 + 1;
  array = (char **)malloc(uVar5 * 8);
  nelem = (int)uVar5;
  pcVar3 = (char *)malloc((ulong)(uint)(iVar6 * nelem));
  *array = pcVar3;
  pcVar3 = f2cstrv2(A7,pcVar3,felem_len,iVar6,nelem);
  uVar4 = 0;
  do {
    array[uVar4] = pcVar3;
    uVar4 = uVar4 + 1;
    pcVar3 = pcVar3 + iVar6;
  } while (uVar5 != uVar4);
  ffgcvs(fptr,colnum,firstrow,firstelem,(long)(int)uVar1,A6,array,A8,A9);
  if (s != (char *)0x0) {
    free(s);
  }
  c2fstrv2(*array,A7,iVar6,felem_len,nelem);
  free(*array);
  free(array);
  *A8 = (uint)(*A8 != 0);
  return;
}

Assistant:

CFextern VOID_cfF(FTGCVSLL,ftgcvsll)
CFARGT14(NCF,DCF,ABSOFT_cf2(VOID),FITSUNIT,INT,LONGLONG,LONGLONG,LONG,STRING,PSTRINGV,PLOGICAL,PINT,CF_0,CF_0,CF_0,CF_0,CF_0))
{
   QCF(FITSUNIT,1)
   QCF(INT,2)
   QCF(LONGLONG,3)
   QCF(LONGLONG,4)
   QCF(LONG,5)
   QCF(STRING,6)
   QCF(PSTRINGV,7)
   QCF(PLOGICAL,8)
   QCF(PINT,9)

   fitsfile *fptr;
   int colnum, *anynul, *status, velem, type;
   LONGLONG firstrow, firstelem;
   long nelem;
   long repeat;
   unsigned long gMinStrLen=80L;  /* gMin = width */
   char *nulval, **array;

   fptr =      TCF(ftgcvsll,FITSUNIT,1,0);
   colnum =    TCF(ftgcvsll,INT,2,0);
   firstrow =  TCF(ftgcvsll,LONGLONG,3,0);
   firstelem = TCF(ftgcvsll,LONGLONG,4,0);
   nelem =     TCF(ftgcvsll,LONG,5,0);
   nulval =    TCF(ftgcvsll,STRING,6,0);
   /*  put off variable 7 (array) until column type is learned  */
   anynul =    TCF(ftgcvsll,PLOGICAL,8,0);
   status =    TCF(ftgcvsll,PINT,9,0);
   
   ffgtcl( fptr, colnum, &type, &repeat, (long *)&gMinStrLen, status );
   if( type<0 ) velem = 1;   /*  Variable length column  */
   else velem = nelem;

   array = TCF(ftgcvsll,PSTRINGV,7,0);

   ffgcvs( fptr, colnum, firstrow, firstelem, nelem, nulval, array,
           anynul, status );

   RCF(FITSUNIT,1)
   RCF(INT,2)
   RCF(LONGLONG,3)
   RCF(LONGLONG,4)
   RCF(LONG,5)
   RCF(STRING,6)
   RCF(PSTRINGV,7)
   RCF(PLOGICAL,8)
   RCF(PINT,9)
}